

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

bool __thiscall duckdb_shell::ShellState::ReadFromFile(ShellState *this,string *file)

{
  int iVar1;
  FILE *pFVar2;
  char *__file;
  int iVar3;
  FILE *pFVar4;
  bool bVar5;
  stat x;
  stat64 local_c0;
  
  if (safe_mode == '\x01') {
    ReadFromFile();
    return false;
  }
  pFVar2 = this->in;
  iVar1 = this->lineno;
  __file = (file->_M_dataplus)._M_p;
  switchD_005700f1::default(&local_c0,0,0x90);
  iVar3 = stat64(__file,&local_c0);
  if ((iVar3 == 0) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
    pFVar4 = fopen64((file->_M_dataplus)._M_p,"rb");
    this->in = (FILE *)pFVar4;
    if (pFVar4 != (FILE *)0x0) {
      iVar3 = ProcessInput(this);
      fclose((FILE *)this->in);
      bVar5 = iVar3 == 0;
      goto LAB_00217bd1;
    }
  }
  ReadFromFile((ShellState *)file);
  bVar5 = false;
LAB_00217bd1:
  this->in = pFVar2;
  this->lineno = iVar1;
  return bVar5;
}

Assistant:

bool ShellState::ReadFromFile(const string &file) {
	if (safe_mode) {
		utf8_printf(stderr, ".read cannot be used in -safe mode\n");
		return false;
	}
	FILE *inSaved = in;
	int savedLineno = lineno;
	int rc;
	if (notNormalFile(file.c_str()) || (in = fopen(file.c_str(), "rb")) == 0) {
		utf8_printf(stderr, "Error: cannot open \"%s\"\n", file.c_str());
		rc = 1;
	} else {
		rc = ProcessInput();
		fclose(in);
	}
	in = inSaved;
	lineno = savedLineno;
	return rc == 0;
}